

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O1

void __thiscall
pfederc::StringToken::StringToken
          (StringToken *this,Token *last,TokenType type,Position *pos,string *str)

{
  pointer pcVar1;
  
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__NumberToken_0010fcf8;
  (this->super_Token).last = last;
  (this->super_Token).type = type;
  (this->super_Token).pos.line = pos->line;
  (this->super_Token).pos.startIndex = pos->startIndex;
  (this->super_Token).pos.endIndex = pos->endIndex;
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__StringToken_0010fd48;
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->str,pcVar1,pcVar1 + str->_M_string_length);
  return;
}

Assistant:

StringToken::StringToken(Token *last, TokenType type, const Position &pos,
            const std::string &str) noexcept
    : Token(last, type, pos), str(str) {
}